

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O3

type __thiscall
asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
          (basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>> *this,
          string *host,string *service,anon_class_8_1_8991fb9c *handler)

{
  _Atomic_word *p_Var1;
  long lVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
  *prVar6;
  error_category *peVar7;
  thread_info_base *this_thread;
  resolver_service_base *this_00;
  long in_FS_OFFSET;
  basic_resolver_query<asio::ip::tcp> q;
  io_context_impl *local_c0;
  ptr local_b8;
  basic_resolver_query<asio::ip::tcp> local_a0;
  
  this_thread = (thread_info_base *)0x0;
  basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_a0,host,
             &mau::ProxySession::
              Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
              ::kAnyProtocolStr_abi_cxx11_,0);
  lVar2 = *(long *)this;
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_b8.h = (anon_class_8_1_8991fb9c *)service;
  prVar6 = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
            *)detail::thread_info_base::allocate(this_thread,0xc0);
  local_b8.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  this_00 = (resolver_service_base *)(lVar2 + 0x28);
  peVar3 = *(element_type **)(this + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10);
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_c0 = this_00->io_context_impl_;
    (prVar6->super_operation).next_ = (scheduler_operation *)0x0;
    (prVar6->super_operation).func_ =
         detail::
         resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
         ::do_complete;
    (prVar6->super_operation).task_result_ = 0;
    (prVar6->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (prVar6->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
    local_c0 = this_00->io_context_impl_;
    (prVar6->super_operation).next_ = (scheduler_operation *)0x0;
    (prVar6->super_operation).func_ =
         detail::
         resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
         ::do_complete;
    (prVar6->super_operation).task_result_ = 0;
    (prVar6->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (prVar6->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var4;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
  }
  (prVar6->query_).hints_.ai_addrlen = local_a0.hints_.ai_addrlen;
  *(undefined4 *)&(prVar6->query_).hints_.field_0x14 = local_a0.hints_._20_4_;
  (prVar6->query_).hints_.ai_addr = local_a0.hints_.ai_addr;
  (prVar6->query_).hints_.ai_canonname = local_a0.hints_.ai_canonname;
  (prVar6->query_).hints_.ai_next = local_a0.hints_.ai_next;
  (prVar6->query_).hints_.ai_flags = local_a0.hints_.ai_flags;
  (prVar6->query_).hints_.ai_family = local_a0.hints_.ai_family;
  (prVar6->query_).hints_.ai_socktype = local_a0.hints_.ai_socktype;
  (prVar6->query_).hints_.ai_protocol = local_a0.hints_.ai_protocol;
  (prVar6->query_).hints_.ai_addrlen = local_a0.hints_.ai_addrlen;
  *(undefined4 *)&(prVar6->query_).hints_.field_0x14 = local_a0.hints_._20_4_;
  (prVar6->query_).hints_.ai_addr = local_a0.hints_.ai_addr;
  (prVar6->query_).host_name_._M_dataplus._M_p = (pointer)&(prVar6->query_).host_name_.field_2;
  local_b8.v = prVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar6->query_).host_name_,local_a0.host_name_._M_dataplus._M_p,
             local_a0.host_name_._M_dataplus._M_p + local_a0.host_name_._M_string_length);
  (prVar6->query_).service_name_._M_dataplus._M_p = (pointer)&(prVar6->query_).service_name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar6->query_).service_name_,local_a0.service_name_._M_dataplus._M_p,
             local_a0.service_name_._M_dataplus._M_p + local_a0.service_name_._M_string_length);
  prVar6->io_context_impl_ = local_c0;
  (prVar6->handler_).this = (ProxySession *)(service->_M_dataplus)._M_p;
  (prVar6->ec_)._M_value = 0;
  peVar7 = (error_category *)std::_V2::system_category();
  (prVar6->ec_)._M_cat = peVar7;
  prVar6->addrinfo_ = (addrinfo_type *)0x0;
  local_b8.p = prVar6;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])(p_Var4);
    }
  }
  detail::resolver_service_base::start_resolve_op(this_00,&(local_b8.p)->super_operation);
  local_b8.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  local_b8.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  detail::
  resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
  ::ptr::reset(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
    operator_delete(local_a0.service_name_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
    operator_delete(local_a0.host_name_._M_dataplus._M_p);
  }
  return;
}

Assistant:

async_resolve(const std::string& host, const std::string& service,
      ASIO_MOVE_ARG(ResolveHandler) handler)
  {
    return async_resolve(host, service, resolver_base::flags(),
        ASIO_MOVE_CAST(ResolveHandler)(handler));
  }